

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobSubstitution.cpp
# Opt level: O0

bool __thiscall
Kernel::RobSubstitution::AssocIterator<Kernel::RobSubstitution::UnificationFn>::hasNext
          (AssocIterator<Kernel::RobSubstitution::UnificationFn> *this)

{
  TermList t2;
  bool bVar1;
  AssocIterator<Kernel::RobSubstitution::UnificationFn> *this_00;
  TermList *pTVar2;
  Literal *in_RDI;
  TermList t22;
  TermList t21;
  TermList t12;
  TermList t11;
  Literal *in_stack_ffffffffffffff98;
  AssocIterator<Kernel::RobSubstitution::UnificationFn> *in_stack_ffffffffffffffa0;
  RobSubstitution *in_stack_ffffffffffffffb0;
  TermList in_stack_ffffffffffffffb8;
  Literal *in_stack_ffffffffffffffc0;
  TermList t1;
  undefined8 in_stack_ffffffffffffffc8;
  int l1Index;
  Literal *in_stack_ffffffffffffffd0;
  RobSubstitution *in_stack_ffffffffffffffd8;
  RobSubstitution *subst;
  
  l1Index = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (in_RDI[1].super_Term._maxRedLen == 3) {
    return false;
  }
  if ((in_RDI[1].super_Term.field_0x1c & 1) == 0) {
    return true;
  }
  in_RDI[1].super_Term.field_0x1c = 0;
  if (in_RDI[1].super_Term._maxRedLen == 0) {
    Lib::Backtrackable::bdRecord
              ((Backtrackable *)in_stack_ffffffffffffffa0,(BacktrackData *)in_stack_ffffffffffffff98
              );
    bVar1 = UnificationFn::associateEqualitySorts
                      (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,l1Index,
                       in_stack_ffffffffffffffc0,(int)(in_stack_ffffffffffffffb8._content >> 0x20));
    if (!bVar1) {
      backtrack(in_stack_ffffffffffffffa0,(BacktrackData *)in_stack_ffffffffffffff98);
      in_RDI[1].super_Term._maxRedLen = 3;
      return false;
    }
  }
  else {
    backtrack(in_stack_ffffffffffffffa0,(BacktrackData *)in_stack_ffffffffffffff98);
  }
  Lib::Backtrackable::bdRecord
            ((Backtrackable *)in_stack_ffffffffffffffa0,(BacktrackData *)in_stack_ffffffffffffff98);
  this_00 = (AssocIterator<Kernel::RobSubstitution::UnificationFn> *)
            (ulong)(uint)in_RDI[1].super_Term._maxRedLen;
  switch(this_00) {
  case (AssocIterator<Kernel::RobSubstitution::UnificationFn> *)0x0:
    bVar1 = UnificationFn::associate(in_stack_ffffffffffffffb0,in_RDI,0,in_stack_ffffffffffffff98,0)
    ;
    if (bVar1) {
      in_RDI[1].super_Term._maxRedLen = 1;
      goto switchD_0096ca32_caseD_3;
    }
    break;
  case (AssocIterator<Kernel::RobSubstitution::UnificationFn> *)0x1:
    break;
  case (AssocIterator<Kernel::RobSubstitution::UnificationFn> *)0x2:
    goto switchD_0096ca32_caseD_2;
  default:
    goto switchD_0096ca32_caseD_3;
  }
  Term::nthArgument(*(Term **)&(in_RDI->super_Term)._maxRedLen,0);
  pTVar2 = Term::nthArgument(*(Term **)&(in_RDI->super_Term)._maxRedLen,1);
  t2._content = pTVar2->_content;
  pTVar2 = Term::nthArgument((Term *)(in_RDI->super_Term)._args[0]._content,0);
  subst = (RobSubstitution *)pTVar2->_content;
  pTVar2 = Term::nthArgument((Term *)(in_RDI->super_Term)._args[0]._content,1);
  t1._content = pTVar2->_content;
  bVar1 = UnificationFn::associate
                    (in_stack_ffffffffffffffb0,t1,(int)((ulong)in_RDI >> 0x20),
                     in_stack_ffffffffffffffb8,(int)in_RDI);
  if ((bVar1) &&
     (bVar1 = UnificationFn::associate(subst,t1,(int)((ulong)in_RDI >> 0x20),t2,(int)in_RDI), bVar1)
     ) {
    in_RDI[1].super_Term._maxRedLen = 2;
  }
  else {
switchD_0096ca32_caseD_2:
    backtrack(this_00,(BacktrackData *)in_stack_ffffffffffffff98);
    backtrack(this_00,(BacktrackData *)in_stack_ffffffffffffff98);
    in_RDI[1].super_Term._maxRedLen = 3;
  }
switchD_0096ca32_caseD_3:
  return in_RDI[1].super_Term._maxRedLen != 3;
}

Assistant:

bool hasNext() {
    if (_state == FINISHED) {
      return false;
    }
    if (!_used) {
      return true;
    }
    _used = false;

    if (_state != FIRST) {
      backtrack(_bdataMain);
    } else {
      _subst->bdRecord(_bdataEqAssoc);
      if (!Fn::associateEqualitySorts(_subst, _l1, _l1i, _l2, _l2i)) {
        backtrack(_bdataEqAssoc); // this might not be necessary
        _state = FINISHED;
        return false;
      }
    }

    _subst->bdRecord(_bdataMain);

    switch (_state) {
    case NEXT_STRAIGHT:
      if (Fn::associate(_subst, _l1, _l1i, _l2, _l2i)) {
        _state = NEXT_REVERSED;
        break;
      }
      //no break here intentionally
    case NEXT_REVERSED: {
      TermList t11 = *_l1->nthArgument(0);
      TermList t12 = *_l1->nthArgument(1);
      TermList t21 = *_l2->nthArgument(0);
      TermList t22 = *_l2->nthArgument(1);
      if (Fn::associate(_subst, t11, _l1i, t22, _l2i)) {
        if (Fn::associate(_subst, t12, _l1i, t21, _l2i)) {
          _state = NEXT_CLEANUP;
          break;
        }
        //the first successful association will be undone
        //in case NEXT_CLEANUP
      }
    }
      //no break here intentionally
    case NEXT_CLEANUP:
      //undo the previous match
      backtrack(_bdataMain);
      //undo associateEqualitySorts
      backtrack(_bdataEqAssoc);
      _state = FINISHED;
      break;
    case FINISHED:
      ASSERTION_VIOLATION;
    }
    ASS(_state != FINISHED || (_bdataMain.isEmpty() && _bdataEqAssoc.isEmpty()));
    return _state != FINISHED;
  }